

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_HashPopulate(Kf_Set_t *p,Kf_Cut_t *pCut)

{
  long lVar1;
  
  if (p->nTEntries != 0) {
    __assert_fail("p->nTEntries == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                  ,399,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
  }
  for (lVar1 = 0; lVar1 < pCut->nLeaves; lVar1 = lVar1 + 1) {
    Kf_HashFindOrAdd(p,pCut->pLeaves[lVar1]);
  }
  if (p->nTEntries == pCut->nLeaves) {
    return;
  }
  __assert_fail("p->nTEntries == pCut->nLeaves",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                ,0x192,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
}

Assistant:

static inline void Kf_HashPopulate( Kf_Set_t * p, Kf_Cut_t * pCut )
{
    int i;
    assert( p->nTEntries == 0 );
    for ( i = 0; i < pCut->nLeaves; i++ )
        Kf_HashFindOrAdd( p, pCut->pLeaves[i] );
    assert( p->nTEntries == pCut->nLeaves );
}